

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_field.cc
# Opt level: O1

string * __thiscall
google::protobuf::compiler::cpp::(anonymous_namespace)::GenerateTemplateForSingleString_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,FieldDescriptor *descriptor,
          StringPiece field_member)

{
  AlphaNum *b;
  FieldDescriptor *field;
  string local_248;
  string local_228;
  SubstituteArg local_208;
  AlphaNum local_1d8;
  SubstituteArg local_1a8;
  SubstituteArg local_178;
  SubstituteArg local_148;
  SubstituteArg local_118;
  SubstituteArg local_e8;
  SubstituteArg local_b8;
  SubstituteArg local_88;
  SubstituteArg local_58;
  
  b = (AlphaNum *)field_member.ptr_;
  if ((*(long *)(*(long *)(this + 0x40) + 8) == 0) || (*(int *)(*(long *)(this + 0x38) + 0x48) != 0)
     ) {
    local_208.text_ = "&";
    local_208.size_ = 1;
    local_208.scratch_[0] = '\0';
    local_208.scratch_[1] = '\0';
    local_208.scratch_[2] = '\0';
    local_208.scratch_[3] = '\0';
    local_1d8.piece_data_ = (char *)descriptor;
    local_1d8.piece_size_ = (size_t)b;
    StrCat_abi_cxx11_(__return_storage_ptr__,(protobuf *)&local_208,&local_1d8,b);
  }
  else {
    local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_228,"$0.IsDefault(nullptr) ? &$1.get() : $0.GetPointer()","",b,
               field_member.length_);
    local_208.size_ = (int)field_member.ptr_;
    local_208.text_ = (char *)descriptor;
    MakeDefaultName_abi_cxx11_(&local_248,(cpp *)this,field);
    local_1d8.piece_data_ = local_248._M_dataplus._M_p;
    local_1d8.piece_size_ =
         CONCAT44(local_1d8.piece_size_._4_4_,(undefined4)local_248._M_string_length);
    local_58.text_ = (char *)0x0;
    local_58.size_ = -1;
    local_88.text_ = (char *)0x0;
    local_88.size_ = -1;
    local_b8.text_ = (char *)0x0;
    local_b8.size_ = -1;
    local_e8.text_ = (char *)0x0;
    local_e8.size_ = -1;
    local_118.text_ = (char *)0x0;
    local_118.size_ = -1;
    local_148.text_ = (char *)0x0;
    local_148.size_ = -1;
    local_178.text_ = (char *)0x0;
    local_178.size_ = -1;
    local_1a8.text_ = (char *)0x0;
    local_1a8.size_ = -1;
    strings::Substitute(__return_storage_ptr__,&local_228,&local_208,(SubstituteArg *)&local_1d8,
                        &local_58,&local_88,&local_b8,&local_e8,&local_118,&local_148,&local_178,
                        &local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      operator_delete(local_228._M_dataplus._M_p);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenerateTemplateForSingleString(const FieldDescriptor* descriptor,
                                            StringPiece field_member) {
  if (descriptor->default_value_string().empty()) {
    return StrCat("&", field_member);
  }

  if (descriptor->options().ctype() == google::protobuf::FieldOptions::STRING) {
    return strings::Substitute(
        "$0.IsDefault(nullptr) ? &$1.get() : $0.GetPointer()", field_member,
        MakeDefaultName(descriptor));
  }

  return StrCat("&", field_member);
}